

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxArray * __thiscall amrex::BoxArray::growcoarsen(BoxArray *this,IntVect *ngrow,IntVect *iv)

{
  int iVar1;
  element_type *peVar2;
  uint uVar3;
  ulong uVar4;
  Box *pBVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int local_34 [3];
  
  uniqify(this);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = ((long)*(pointer *)
                  ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) -
          *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data) / 0x1c;
  uVar10 = 0;
  uVar9 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar9 = uVar10;
  }
  do {
    if (uVar10 == uVar9) {
      return this;
    }
    pBVar5 = Box::grow((Box *)(uVar10 * 0x1c +
                              *(long *)&(((this->m_ref).
                                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data),ngrow);
    iVar1 = iv->vect[0];
    if ((iVar1 == 1) && (iv->vect[1] == 1)) {
      if (iv->vect[2] != 1) {
        uVar3 = (pBVar5->smallend).vect[0];
        goto LAB_0041c96e;
      }
    }
    else {
      uVar3 = (pBVar5->smallend).vect[0];
      if (iVar1 != 1) {
        if (iVar1 == 4) {
          if ((int)uVar3 < 0) {
            uVar3 = (int)uVar3 >> 2;
          }
          else {
            uVar3 = uVar3 >> 2;
          }
        }
        else if (iVar1 == 2) {
          if ((int)uVar3 < 0) {
            uVar3 = (int)uVar3 >> 1;
          }
          else {
            uVar3 = uVar3 >> 1;
          }
        }
        else if ((int)uVar3 < 0) {
          uVar3 = ~((int)~uVar3 / iVar1);
        }
        else {
          uVar3 = (int)uVar3 / iVar1;
        }
      }
LAB_0041c96e:
      (pBVar5->smallend).vect[0] = uVar3;
      uVar3 = (pBVar5->smallend).vect[1];
      iVar1 = iv->vect[1];
      if (iVar1 != 1) {
        if (iVar1 == 4) {
          if ((int)uVar3 < 0) {
            uVar3 = (int)uVar3 >> 2;
          }
          else {
            uVar3 = uVar3 >> 2;
          }
        }
        else if (iVar1 == 2) {
          if ((int)uVar3 < 0) {
            uVar3 = (int)uVar3 >> 1;
          }
          else {
            uVar3 = uVar3 >> 1;
          }
        }
        else if ((int)uVar3 < 0) {
          uVar3 = ~((int)~uVar3 / iVar1);
        }
        else {
          uVar3 = (int)uVar3 / iVar1;
        }
      }
      (pBVar5->smallend).vect[1] = uVar3;
      uVar3 = (pBVar5->smallend).vect[2];
      iVar1 = iv->vect[2];
      if (iVar1 != 1) {
        if (iVar1 == 4) {
          if ((int)uVar3 < 0) {
            uVar3 = (int)uVar3 >> 2;
          }
          else {
            uVar3 = uVar3 >> 2;
          }
        }
        else if (iVar1 == 2) {
          if ((int)uVar3 < 0) {
            uVar3 = (int)uVar3 >> 1;
          }
          else {
            uVar3 = uVar3 >> 1;
          }
        }
        else if ((int)uVar3 < 0) {
          uVar3 = ~((int)~uVar3 / iVar1);
        }
        else {
          uVar3 = (int)uVar3 / iVar1;
        }
      }
      (pBVar5->smallend).vect[2] = uVar3;
      uVar3 = (pBVar5->btype).itype;
      if (uVar3 == 0) {
        uVar3 = (pBVar5->bigend).vect[0];
        iVar1 = iv->vect[0];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 2;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 1;
            }
            else {
              uVar3 = uVar3 >> 1;
            }
          }
          else if ((int)uVar3 < 0) {
            uVar3 = ~((int)~uVar3 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar5->bigend).vect[0] = uVar3;
        uVar3 = (pBVar5->bigend).vect[1];
        iVar1 = iv->vect[1];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 2;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 1;
            }
            else {
              uVar3 = uVar3 >> 1;
            }
          }
          else if ((int)uVar3 < 0) {
            uVar3 = ~((int)~uVar3 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar5->bigend).vect[1] = uVar3;
        uVar3 = (pBVar5->bigend).vect[2];
        iVar1 = iv->vect[2];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 2;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 1;
            }
            else {
              uVar3 = uVar3 >> 1;
            }
          }
          else if ((int)uVar3 < 0) {
            uVar3 = ~((int)~uVar3 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
      }
      else {
        local_34[0] = 0;
        local_34[1] = 0;
        local_34[2] = 0;
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          if (((uVar3 >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
             ((pBVar5->bigend).vect[lVar8] % iv->vect[lVar8] != 0)) {
            local_34[lVar8] = 1;
          }
        }
        uVar6 = (pBVar5->bigend).vect[0];
        iVar1 = iv->vect[0];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar6 < 0) {
              uVar6 = (int)uVar6 >> 2;
            }
            else {
              uVar6 = uVar6 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar6 < 0) {
              uVar6 = (int)uVar6 >> 1;
            }
            else {
              uVar6 = uVar6 >> 1;
            }
          }
          else if ((int)uVar6 < 0) {
            uVar6 = ~((int)~uVar6 / iVar1);
          }
          else {
            uVar6 = (int)uVar6 / iVar1;
          }
        }
        (pBVar5->bigend).vect[0] = uVar6;
        uVar7 = (pBVar5->bigend).vect[1];
        iVar1 = iv->vect[1];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar7 < 0) {
              uVar7 = (int)uVar7 >> 2;
            }
            else {
              uVar7 = uVar7 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar7 < 0) {
              uVar7 = (int)uVar7 >> 1;
            }
            else {
              uVar7 = uVar7 >> 1;
            }
          }
          else if ((int)uVar7 < 0) {
            uVar7 = ~((int)~uVar7 / iVar1);
          }
          else {
            uVar7 = (int)uVar7 / iVar1;
          }
        }
        (pBVar5->bigend).vect[1] = uVar7;
        uVar3 = (pBVar5->bigend).vect[2];
        iVar1 = iv->vect[2];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 2;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 1;
            }
            else {
              uVar3 = uVar3 >> 1;
            }
          }
          else if ((int)uVar3 < 0) {
            uVar3 = ~((int)~uVar3 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar5->bigend).vect[0] = uVar6 + local_34[0];
        (pBVar5->bigend).vect[1] = uVar7 + local_34[1];
        uVar3 = uVar3 + local_34[2];
      }
      (pBVar5->bigend).vect[2] = uVar3;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

BoxArray&
BoxArray::growcoarsen (IntVect const& ngrow, const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].grow(ngrow).coarsen(iv);
    }
    return *this;
}